

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

bool QtPrivate::q_points_into_range<QArrayDataPointer<CborValue>,CborValue_const*>
               (CborValue **p,QArrayDataPointer<CborValue> *c)

{
  undefined8 uVar1;
  bool bVar2;
  CborValue *__last;
  CborValue *__first;
  difference_type dVar3;
  undefined8 *in_RDI;
  
  uVar1 = *in_RDI;
  __last = std::data<QArrayDataPointer<CborValue>>((QArrayDataPointer<CborValue> *)0x8d9315);
  __first = std::data<QArrayDataPointer<CborValue>>((QArrayDataPointer<CborValue> *)0x8d9324);
  std::begin<QArrayDataPointer<CborValue>>((QArrayDataPointer<CborValue> *)0x8d9333);
  std::end<QArrayDataPointer<CborValue>>((QArrayDataPointer<CborValue> *)0x8d9344);
  dVar3 = std::distance<CborValue_const*>(__first,__last);
  bVar2 = q_points_into_range<CborValue,std::less<void>>(uVar1,__last,__first + dVar3);
  return bVar2;
}

Assistant:

static constexpr bool q_points_into_range(const T &p, const C &c) noexcept
{
    static_assert(std::is_same_v<decltype(std::data(c)), T>);

    // std::distance because QArrayDataPointer has a "qsizetype size"
    // member but no size() function
    return q_points_into_range(p, std::data(c),
                               std::data(c) + std::distance(std::begin(c), std::end(c)));
}